

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

BOOL __thiscall
Js::GlobalObject::DeleteRootProperty
          (GlobalObject *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  HostObjectBase *pHVar1;
  BOOL BVar2;
  int iVar3;
  RecyclableObject *pRVar4;
  
  BVar2 = RootObjectBase::HasRootProperty(&this->super_RootObjectBase,propertyId);
  if (BVar2 != 0) {
    BVar2 = RootObjectBase::DeleteRootProperty(&this->super_RootObjectBase,propertyId,flags);
    return BVar2;
  }
  pRVar4 = (this->directHostObject).ptr;
  if (pRVar4 != (RecyclableObject *)0x0) {
    iVar3 = (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0xb])(pRVar4,(ulong)(uint)propertyId,0);
    if (iVar3 == 1) {
      pRVar4 = (this->directHostObject).ptr;
      goto LAB_00b5d70a;
    }
  }
  pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
  if (pHVar1 != (HostObjectBase *)0x0) {
    iVar3 = (**(code **)(*(long *)pHVar1 + 0x58))(pHVar1,propertyId,0);
    if (iVar3 == 1) {
      pRVar4 = (RecyclableObject *)(this->super_RootObjectBase).hostObject.ptr;
LAB_00b5d70a:
      iVar3 = (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x21])(pRVar4,(ulong)(uint)propertyId,(ulong)flags);
      return iVar3;
    }
  }
  return 1;
}

Assistant:

BOOL GlobalObject::DeleteRootProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        if (__super::HasRootProperty(propertyId))
        {
            return __super::DeleteRootProperty(propertyId, flags);
        }
        else if (this->directHostObject && this->directHostObject->HasProperty(propertyId))
        {
            return this->directHostObject->DeleteProperty(propertyId, flags);
        }
        else if (this->hostObject && this->hostObject->HasProperty(propertyId))
        {
            return this->hostObject->DeleteProperty(propertyId, flags);
        }

        // Non-existent property
        return TRUE;
    }